

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith.hpp
# Opt level: O3

size_t arith_decompress(uint32_t *obuff,size_t osize,uint8_t *ibuff,size_t isize)

{
  size_type __n;
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  long lVar5;
  int offset;
  uint32_t uVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  size_t sVar10;
  byte *pbVar11;
  allocator_type *__a;
  ulong uVar12;
  int extraout_EDX;
  int extraout_EDX_00;
  int silent;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  size_t sVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  uint64_t newv;
  long lVar21;
  vector<unsigned_int,_std::allocator<unsigned_int>_> F;
  allocator_type local_69;
  size_t local_68;
  size_t local_60;
  uint32_t *local_58;
  value_type local_4c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  uVar7 = 0;
  lVar21 = 0;
  pbVar11 = ibuff;
  do {
    bVar1 = *pbVar11;
    pbVar11 = pbVar11 + 1;
    uVar12 = uVar7 & 0x3f;
    uVar7 = uVar7 + 8;
    lVar21 = lVar21 + ((ulong)bVar1 << uVar12);
  } while (uVar7 != 0x20);
  auVar4 = vpmovzxbq_avx2(ZEXT416(*(uint *)(ibuff + 4)));
  __n = lVar21 + 2;
  __a = &local_69;
  local_4c = 0;
  auVar4 = vpsllvq_avx2(auVar4,_DAT_0013cb00);
  auVar2 = vpor_avx(auVar4._0_16_,auVar4._16_16_);
  auVar3 = vpshufd_avx(auVar2,0xee);
  auVar2 = vpaddq_avx(auVar2,auVar3);
  local_68 = isize;
  local_60 = osize;
  local_58 = obuff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_48,__n,&local_4c,__a);
  if (auVar2._0_8_ + 1U < 1000) {
    sVar8 = interp_decompress(local_48.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,__n,ibuff + 8,(size_t)__a);
    silent = extraout_EDX;
  }
  else {
    sVar8 = arith_decompress(local_48.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start,__n,ibuff + 8,local_68 - 8);
    silent = extraout_EDX_00;
  }
  uVar7 = lVar21 + 1;
  scale_counts(&local_48,uVar7,silent);
  *local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  if (uVar7 != 0) {
    uVar6 = *local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar12 = 0;
    do {
      uVar6 = uVar6 + local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar12 + 1];
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar12 + 1] = uVar6;
      uVar12 = uVar12 + 1;
    } while (uVar7 != uVar12);
  }
  lVar21 = 0;
  uVar12 = 0;
  do {
    lVar5 = lVar21 + sVar8 + 8;
    lVar21 = lVar21 + 1;
    uVar12 = (ulong)ibuff[lVar5] | uVar12 << 8;
  } while ((int)lVar21 != 7);
  sVar8 = sVar8 + 0xf;
  if (local_60 != 0) {
    sVar17 = 0;
    uVar16 = 0;
    uVar14 = 0xffffffffffffff;
    do {
      uVar20 = uVar14 >> 0x1f;
      uVar9 = uVar12 / uVar20;
      if (0x7ffffffe < uVar9) {
        uVar9 = 0x7fffffff;
      }
      if (0 < (int)uVar7) {
        uVar13 = 0;
        uVar18 = uVar7 & 0xffffffff;
        do {
          uVar15 = uVar13 + 1 + (int)uVar18 >> 1;
          uVar16 = (ulong)uVar15;
          uVar19 = uVar16;
          if ((local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar16 - 1] <= uVar9) &&
             (uVar19 = uVar18, uVar13 = uVar15,
             (uint)uVar9 <
             local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar16])) break;
          uVar18 = uVar19;
        } while ((int)uVar13 < (int)uVar19);
      }
      local_58[sVar17] = (int)uVar16 - 1;
      lVar21 = uVar20 * local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar16 - 1];
      uVar12 = uVar12 - lVar21;
      uVar14 = uVar14 - lVar21;
      if (-1 < (int)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start[uVar16]) {
        uVar14 = ((ulong)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar16] -
                 (ulong)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar16 - 1]) * uVar20;
      }
      if (uVar14 >> 0x30 == 0) {
        sVar10 = local_68;
        uVar9 = uVar14;
        if (local_68 < sVar8) {
          sVar10 = sVar8;
        }
        do {
          if (sVar10 == sVar8) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"I/O error",9);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            exit(1);
          }
          pbVar11 = ibuff + sVar8;
          uVar14 = uVar9 << 8;
          sVar8 = sVar8 + 1;
          uVar12 = (uVar12 & 0xffffffffffff) << 8 | (ulong)*pbVar11;
          uVar20 = uVar9 >> 0x28;
          uVar9 = uVar14;
        } while (uVar20 == 0);
      }
      sVar17 = sVar17 + 1;
    } while (sVar17 != local_60);
  }
  operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  return sVar8;
}

Assistant:

size_t arith_decompress(uint32_t* obuff, /* output buffer */
    size_t osize, /* number symbols to be decoded */
    const uint8_t* ibuff, /* input buffer */
    size_t isize)
{ /* size of input buffer */

    int i;
    size_t op, ip = 0;

    /* state variables for decoding */
    uint64_t R = FULL;
    uint64_t D;
    uint64_t low, high, total, scale;
    uint64_t target;
    uint64_t v = 0;
    size_t maxv;
    size_t nunq;

    /* fetch the prelude */
    ip += byte_decode(ibuff + ip, isize - ip, (1LL << 31), &target);
    maxv = target;
    ip += byte_decode(ibuff + ip, isize - ip, (1LL << 31), &target);
    nunq = target;

    std::vector<uint32_t> F(maxv + 1, 0);

    if (nunq < PREL_RECURSE) {
        /* small enough that inefficient approach is ok */
        ip += interp_decompress(F.data(), maxv + 1, ibuff + ip, isize - ip);
    } else {
        /* or else, tadaa, recursive call for prelude... */
        ip += arith_decompress(F.data(), maxv + 1, ibuff + ip, isize - ip);
    }

    /* adjust and scale the counts like the encoder did */
    total = scale_counts(F, maxv, 1);

    /* convert to cumulative sums */
    F[0] = 0;
    for (i = 1; i <= maxv; i++) {
        F[i] = F[i - 1] + F[i];
    }

    /* load up D */
    D = 0;
    for (i = 0; i < BBYTES; i++) {
        D <<= 8;
        D += ibuff[ip++];
    }

    /* and decode the required symbols one by one */
    for (op = 0; op < osize; op++) {
        /* decode target */
        scale = R >> TBTS;
        target = D / scale;

        /* beware of the rounding that might accrue at the top of the
                   range, and adjust downward if required */
        if (target >= total)
            target = total - 1;
        /* binary search in F for target is a little faster */
        {
            int lo = 0, hi = maxv;
            /* elements F[lo..hi] inclusive being considered */
            while (lo < hi) {
                v = (1 + lo + hi) >> 1;
                if (F[v - 1] > target) {
                    hi = v;
                } else if (target >= F[v]) {
                    lo = v;
                } else {
                    break;
                }
            }
        }

        /* (could also take leading bits of target to index a table
                   and accelerate the search, leave that for another day)
                */
        obuff[op] = v - 1;

        /* adjust, tracing the encoder, with D=V-L throughout */
        low = F[v - 1];
        high = F[v];
        D -= low * scale;
        if (high < total) {
            R = (high - low) * scale;
        } else {
            R = R - low * scale;
        }

        while (R < PART) {
            if (ip >= isize) {
                std::cerr << "I/O error" << std::endl;
                exit(EXIT_FAILURE);
            }
            /* range has shrunk, time to bring in another byte */
            R <<= 8;
            D <<= 8;
            D &= FULL;
            D += ibuff[ip++];
        }
    }
    return ip;
}